

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

int mg_map_equal(mg_map *lhs,mg_map *rhs)

{
  mg_string **ppmVar1;
  mg_string **ppmVar2;
  int iVar3;
  uint uVar4;
  mg_string *pmVar5;
  mg_string *pmVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar9 = (ulong)lhs->size;
  uVar4 = 0;
  if (lhs->size == rhs->size) {
    if (uVar9 == 0) {
      uVar4 = 1;
    }
    else {
      ppmVar1 = lhs->keys;
      ppmVar2 = rhs->keys;
      pmVar5 = *ppmVar1;
      pmVar6 = *ppmVar2;
      uVar7 = pmVar5->size;
      uVar4 = 0;
      if (uVar7 == pmVar6->size) {
        uVar8 = 1;
        bVar10 = false;
        while( true ) {
          iVar3 = bcmp(pmVar5->data,pmVar6->data,(ulong)uVar7);
          if (iVar3 != 0) break;
          iVar3 = mg_value_equal(lhs->values[uVar8 - 1],rhs->values[uVar8 - 1]);
          if ((iVar3 == 0) || (bVar10 = uVar9 <= uVar8, uVar8 == uVar9)) break;
          pmVar5 = ppmVar1[uVar8];
          pmVar6 = ppmVar2[uVar8];
          uVar7 = pmVar5->size;
          uVar8 = uVar8 + 1;
          if (uVar7 != pmVar6->size) break;
        }
        uVar4 = (uint)bVar10;
      }
    }
  }
  return uVar4;
}

Assistant:

int mg_map_equal(const mg_map *lhs, const mg_map *rhs) {
  if (lhs->size != rhs->size) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->size; ++i) {
    if (!mg_string_equal(lhs->keys[i], rhs->keys[i])) return 0;
    if (!mg_value_equal(lhs->values[i], rhs->values[i])) return 0;
  }
  return 1;
}